

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O2

RAState * __thiscall asmjit::X86RAPass::saveState(X86RAPass *this)

{
  Zone *this_00;
  void *pvVar1;
  long lVar2;
  uint32_t i;
  RAState *__dest;
  ulong uVar3;
  ulong uVar4;
  
  this_00 = (this->super_RAPass)._zone;
  uVar4 = (ulong)(uint)(this->super_RAPass)._contextVd.super_ZoneVectorBase._length;
  pvVar1 = (this->super_RAPass)._contextVd.super_ZoneVectorBase._data;
  __dest = (RAState *)this_00->_ptr;
  uVar3 = uVar4 + 0x15f & 0xfffffffffffffff8;
  if ((ulong)((long)this_00->_end - (long)__dest) < uVar3) {
    __dest = (RAState *)Zone::_alloc(this_00,uVar3);
  }
  else {
    this_00->_ptr = (uint8_t *)(__dest + uVar3);
    if ((RAState *)this_00->_end < __dest + uVar3) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/../x86/../base/../base/../base/../base/zone.h"
                 ,0x9b,"_ptr <= _end");
    }
  }
  if (__dest != (RAState *)0x0) {
    memcpy(__dest,&this->_x86State,0x140);
    *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(__dest + 0x140) =
         (this->_x86State)._occupied.field_0;
    *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(__dest + 0x148) =
         (this->_x86State)._modified.field_0;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      lVar2 = *(long *)((long)pvVar1 + uVar3 * 8);
      __dest[uVar3 + 0x150] = (RAState)0x0;
      __dest[uVar3 + 0x150] = (RAState)(*(byte *)(lVar2 + 0x24) & 3);
    }
  }
  return __dest;
}

Assistant:

RAState* X86RAPass::saveState() {
  VirtReg** vregs = _contextVd.getData();
  uint32_t count = static_cast<uint32_t>(_contextVd.getLength());

  size_t size = Utils::alignTo<size_t>(
    sizeof(X86RAState) + count * sizeof(X86StateCell), sizeof(void*));

  X86RAState* cur = getState();
  X86RAState* dst = _zone->allocT<X86RAState>(size);
  if (!dst) return nullptr;

  // Store links.
  ::memcpy(dst->_list, cur->_list, X86RAState::kAllCount * sizeof(VirtReg*));

  // Store masks.
  dst->_occupied = cur->_occupied;
  dst->_modified = cur->_modified;

  // Store cells.
  for (uint32_t i = 0; i < count; i++) {
    VirtReg* vreg = static_cast<VirtReg*>(vregs[i]);
    X86StateCell& cell = dst->_cells[i];

    cell.reset();
    cell.setState(vreg->getState());
  }

  return dst;
}